

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O3

void __thiscall chrono::ChLinkUniversal::ArchiveOUT(ChLinkUniversal *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChFrame<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkUniversal>(marchive);
  ChLink::ArchiveOUT(&this->super_ChLink,marchive);
  local_38._value = &this->m_frame1;
  local_38._name = "m_frame1";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFrame<double>>(marchive,&local_38);
  local_38._value = &this->m_frame2;
  local_38._name = "m_frame2";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFrame<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChLinkUniversal::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkUniversal>();

    // serialize parent class
    ChLink::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(m_frame1);
    marchive << CHNVP(m_frame2);
}